

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O1

wstring * __thiscall
PDA::Utils::Misc::toBase64_abi_cxx11_
          (wstring *__return_storage_ptr__,Misc *this,uchar *buffer,size_t size)

{
  pointer pwVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = buffer + 2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::wstring::_M_construct
            ((ulong)__return_storage_ptr__,
             SUB164(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffc);
  uVar4 = (ulong)buffer / 3;
  if (buffer < (uchar *)0x3) {
    lVar3 = 0;
  }
  else {
    pwVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    lVar3 = 0;
    do {
      pwVar1[lVar3] =
           *(wchar_t *)
            ((long)L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
            (ulong)((byte)*this & 0xfffffffc));
      pwVar1[lVar3 + 1] =
           L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [((byte)*this & 3) << 4 | (uint)((byte)this[1] >> 4)];
      pwVar1[lVar3 + 2] =
           L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uint)((byte)this[2] >> 6) + ((byte)this[1] & 0xf) * 4];
      pwVar1[lVar3 + 3] =
           L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(byte)this[2] & 0x3f]
      ;
      lVar3 = lVar3 + 4;
      this = this + 3;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if ((ulong)buffer % 3 == 1) {
    pwVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pwVar1[lVar3] =
         *(wchar_t *)
          ((long)L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
          (ulong)((byte)*this & 0xfffffffc));
    pwVar1[lVar3 + 1] =
         L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [((ulong)(byte)*this & 3) * 0x10];
  }
  else if ((ulong)buffer % 3 == 2) {
    pwVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pwVar1[lVar3] =
         *(wchar_t *)
          ((long)L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/" +
          (ulong)((byte)*this & 0xfffffffc));
    pwVar1[lVar3 + 1] =
         L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [((byte)*this & 3) << 4 | (uint)((byte)this[1] >> 4)];
    pwVar1[lVar3 + 2] =
         L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [((ulong)(byte)this[1] & 0xf) * 4];
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring Misc::toBase64(unsigned char const* buffer, size_t size){
    using std::wstring;
    static wchar_t const* base64Table =
        L"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

    size_t base64Size = (size + 2 - ((size + 2) % 3)) / 3 * 4;
    wstring result(base64Size, L'A');

    unsigned char const* s = buffer;  // source pointer
    size_t di = 0;                    // destination index
    for(size_t i = 0; i < size / 3; i++){
        // input: 0000_0000 0000_0000 0000_0000
        //
        // out1:  0000_00
        // out2:         00 0000
        // out3:                _0000 00
        // out4:                        00_0000

        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[((s[0] << 4) | (s[1] >> 4)) & 0x3f];
        result[di++] = base64Table[((s[1] << 2) | (s[2] >> 6)) & 0x3f];
        result[di++] = base64Table[s[2] & 0x3f];
        s += 3;
    }

    size_t remainSize = size % 3;
    switch(remainSize){
    case 0:
        break;
    case 1:
        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[(s[0] << 4) & 0x3f];
        break;
    case 2:
        result[di++] = base64Table[s[0] >> 2];
        result[di++] = base64Table[((s[0] << 4) | (s[1] >> 4)) & 0x3f];
        result[di++] = base64Table[(s[1] << 2) & 0x3f];
        break;
    }
    return result;
}